

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

void duckdb::ValidateOffsetInFile
               (string *filename,idx_t col_idx,idx_t file_length,idx_t offset,string *offset_name)

{
  IOException *this;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (offset < file_length) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "File \'%s\': metadata is corrupt. Column %d has invalid %s (offset=%llu file_size=%llu)."
             ,&local_91);
  ::std::__cxx11::string::string((string *)&local_70,(string *)filename);
  ::std::__cxx11::string::string((string *)&local_90,(string *)offset_name);
  IOException::
  IOException<std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,unsigned_long>
            (this,&local_50,&local_70,col_idx,&local_90,offset,file_length);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ValidateOffsetInFile(const string &filename, idx_t col_idx, idx_t file_length, idx_t offset,
                                 const string &offset_name) {
	if (offset >= file_length) {
		throw IOException("File '%s': metadata is corrupt. Column %d has invalid "
		                  "%s (offset=%llu file_size=%llu).",
		                  filename, col_idx, offset_name, offset, file_length);
	}
}